

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O2

benchmark * __thiscall
picobench::registry::add_benchmark(registry *this,char *name,benchmark_proc proc)

{
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  *this_00;
  benchmark_impl *b;
  
  b = (benchmark_impl *)operator_new(0x60);
  (b->super_benchmark)._name = name;
  (b->super_benchmark)._proc = proc;
  (b->super_benchmark)._baseline = false;
  (b->super_benchmark)._user_data = 0;
  (b->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_benchmark)._samples = 0;
  (b->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->_istate)._M_current = (state *)0x0;
  this_00 = (vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
             *)benchmarks_for_current_suite(this);
  std::
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  ::emplace_back<picobench::benchmark_impl*&>(this_00,&b);
  return &b->super_benchmark;
}

Assistant:

benchmark& add_benchmark(const char* name, benchmark_proc proc)
    {
        auto b = new benchmark_impl(name, proc);
        benchmarks_for_current_suite().emplace_back(b);
        return *b;
    }